

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnEndExpr(BinaryReaderInterp *this)

{
  pointer *ppLVar1;
  LabelType LVar2;
  uint uVar3;
  Istream *this_00;
  pointer pHVar4;
  Result RVar5;
  Offset OVar6;
  Label *pLVar7;
  Enum EVar8;
  Label *label;
  Location loc;
  
  EVar8 = Ok;
  if ((long)(this->label_stack_).
            super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->label_stack_).
            super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x10) {
    RVar5 = TypeChecker::GetLabel(&(this->validator_).typechecker_,0,&label);
    EVar8 = Error;
    if (RVar5.enum_ != Error) {
      LVar2 = label->label_type;
      loc.field_1.field_0.last_column = 0;
      loc.filename._M_len = (this->filename_)._M_len;
      loc.filename._M_str = (this->filename_)._M_str;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      RVar5 = SharedValidator::OnEnd(&this->validator_,&loc);
      if (RVar5.enum_ != Error) {
        if ((LVar2 & ~InitExpr) == If) {
          this_00 = this->istream_;
          pLVar7 = TopLabel(this);
          Istream::ResolveFixupU32(this_00,pLVar7->fixup_offset);
        }
        else if (LVar2 == Catch) {
          Istream::EmitCatchDrop(this->istream_,1);
        }
        else if (LVar2 == TryTable) {
          pLVar7 = TopLabel(this);
          uVar3 = pLVar7->handler_desc_index;
          pHVar4 = (this->func_->handlers).
                   super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          OVar6 = Istream::end(this->istream_);
          pHVar4[uVar3].try_end_offset = OVar6;
        }
        else if (LVar2 == Try) {
          pLVar7 = TopLabel(this);
          uVar3 = pLVar7->handler_desc_index;
          pHVar4 = (this->func_->handlers).
                   super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          OVar6 = Istream::end(this->istream_);
          pHVar4[uVar3].try_end_offset = OVar6;
          if (*(pointer *)
               ((long)&pHVar4[uVar3].catches.
                       super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                       ._M_impl + 8) !=
              *(pointer *)
               &pHVar4[uVar3].catches.
                super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                ._M_impl) {
            __assert_fail("desc.catches.size() == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                          ,0x43d,
                          "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnEndExpr()"
                         );
          }
        }
        FixupTopLabel(this);
        ppLVar1 = &(this->label_stack_).
                   super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppLVar1 = *ppLVar1 + -1;
        EVar8 = Ok;
      }
    }
  }
  return (Result)EVar8;
}

Assistant:

Result BinaryReaderInterp::OnTernaryExpr(Opcode opcode) {
  CHECK_RESULT(validator_.OnTernary(GetLocation(), opcode));
  istream_.Emit(opcode);
  return Result::Ok;
}